

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::~cmGlobalGhsMultiGenerator(cmGlobalGhsMultiGenerator *this)

{
  ~cmGlobalGhsMultiGenerator(this);
  operator_delete(this,0x728);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::~cmGlobalGhsMultiGenerator() = default;